

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O0

bool __thiscall
ON_Plane::CreateFromFrame(ON_Plane *this,ON_3dPoint *P,ON_3dVector *X,ON_3dVector *Y)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool local_b9;
  undefined1 auStack_b8 [7];
  bool b;
  double local_b0;
  double local_a8;
  ON_3dVector local_a0;
  ON_3dVector local_88;
  undefined1 local_70 [8];
  ON_3dVector localY;
  ON_3dVector localX;
  ON_3dPoint localP;
  ON_3dVector *Y_local;
  ON_3dVector *X_local;
  ON_3dPoint *P_local;
  ON_Plane *this_local;
  
  dVar3 = P->y;
  dVar4 = P->z;
  localY.z = X->x;
  dVar1 = X->y;
  dVar2 = X->z;
  local_70 = (undefined1  [8])Y->x;
  localY.x = Y->y;
  localY.y = Y->z;
  (this->origin).x = P->x;
  (this->origin).y = dVar3;
  (this->origin).z = dVar4;
  (this->xaxis).x = localY.z;
  (this->xaxis).y = dVar1;
  (this->xaxis).z = dVar2;
  ON_3dVector::Unitize(&this->xaxis);
  dVar3 = ON_DotProduct((ON_3dVector *)local_70,&this->xaxis);
  ::operator*(&local_a0,dVar3,&this->xaxis);
  ON_3dVector::operator-(&local_88,(ON_3dVector *)local_70,&local_a0);
  (this->yaxis).x = local_88.x;
  (this->yaxis).y = local_88.y;
  (this->yaxis).z = local_88.z;
  ON_3dVector::Unitize(&this->yaxis);
  ON_CrossProduct((ON_3dVector *)auStack_b8,&this->xaxis,&this->yaxis);
  (this->zaxis).x = _auStack_b8;
  (this->zaxis).y = local_b0;
  (this->zaxis).z = local_a8;
  local_b9 = ON_3dVector::Unitize(&this->zaxis);
  UpdateEquation(this);
  if ((local_b9) && (local_b9 = IsValid(this), local_b9)) {
    dVar3 = ON_3dVector::operator*((ON_3dVector *)local_70,&this->zaxis);
    dVar4 = ON_3dVector::Length((ON_3dVector *)local_70);
    if (dVar4 * 1.490116119385e-08 < ABS(dVar3)) {
      local_b9 = false;
    }
  }
  return local_b9;
}

Assistant:

bool ON_Plane::CreateFromFrame(
    const ON_3dPoint&  P, // point on the plane
    const ON_3dVector& X, // non-zero vector in plane
    const ON_3dVector& Y  // another non-zero vector in the plane
    )
{
  const ON_3dPoint localP(P);
  const ON_3dVector localX(X);
  const ON_3dVector localY(Y);


  origin = localP;

  xaxis = localX;
  xaxis.Unitize();
  yaxis = localY - ON_DotProduct( localY, xaxis)*xaxis;
  yaxis.Unitize();
  zaxis = ON_CrossProduct( xaxis, yaxis );
  bool b = zaxis.Unitize();
  UpdateEquation();
  if ( b )
  {
    // 11 February 2004 Dale Lear
    //     Add more validation checks.
    b = IsValid();
    if ( b )
    {
      // make sure zaxis is perp to localY
      if ( fabs(localY*zaxis) > ON_SQRT_EPSILON*localY.Length() )
        b = false;
    }
  }
  return b;
}